

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store_array_text<embree::Vec2<int>>
          (XMLWriter *this,char *name,
          vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *vec)

{
  Vec2<int> VVar1;
  int __oflag;
  ulong uVar2;
  ulong uVar3;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_80;
  char *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)local_50,name,(allocator *)&local_80.field_0);
  open(this,(char *)local_50,__oflag);
  local_78 = name;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((vec->super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (vec->super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      if (this->ident != 0) {
        uVar2 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->ident);
      }
      VVar1.field_0 =
           (anon_union_8_2_4062524c_for_Vec2<int>_1)
           *(anon_union_8_2_4062524c_for_Vec2<int>_1 *)
            &(vec->super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar3].field_0.field_0;
      local_80._0_4_ = (float)VVar1.field_0._0_4_;
      local_80._4_4_ = (float)VVar1.field_0._4_4_;
      store_array_elt(this,(Vec2f *)&local_80.field_0);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(vec->
                                   super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(vec->
                                   super__Vector_base<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__cxx11::string::string((string *)local_70,local_78,(allocator *)&local_80.field_0);
  close(this,(int)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }